

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calculateEdgeDerivatives
          (BeagleCPUImpl<float,_1,_0> *this,int *postBufferIndices,int *preBufferIndices,
          int *derivativeMatrixIndices,int *categoryWeightsIndices,int *categoryRatesIndices,
          int *cumulativeScaleIndices,int count,double *outDerivatives,double *outSumDerivatives,
          double *outSumSquaredDerivatives)

{
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  undefined8 in_R8;
  
  iVar1 = (**(code **)(*in_RDI + 0x1b0))(in_RDI,in_RSI,in_RDX,in_RCX,0,in_R8);
  return iVar1;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calculateEdgeDerivatives(const int *postBufferIndices,
                                                                   const int *preBufferIndices,
                                                                   const int *derivativeMatrixIndices,
                                                                   const int *categoryWeightsIndices,
                                                                   const int *categoryRatesIndices,
                                                                   const int *cumulativeScaleIndices,
                                                                   int count,
                                                                   double *outDerivatives,
                                                                   double *outSumDerivatives,
                                                                   double *outSumSquaredDerivatives) {
    return calcEdgeLogDerivatives(
            postBufferIndices, preBufferIndices,
            derivativeMatrixIndices, NULL,
            categoryWeightsIndices,categoryRatesIndices, cumulativeScaleIndices,
            count,
            outDerivatives,
            outSumDerivatives, outSumSquaredDerivatives);
}